

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O0

void Abc_FrameSwapCurrentAndBackup(Abc_Frame_t *p)

{
  Abc_Ntk_t *pNtk;
  int iStep;
  int iStep_00;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNetBackup;
  int iStepBack;
  int iStepCur;
  Abc_Ntk_t *pNtkBack2;
  Abc_Ntk_t *pNtkBack;
  Abc_Ntk_t *pNtkCur;
  Abc_Frame_t *p_local;
  
  pNtk = p->pNtkCur;
  pNtk_00 = Abc_NtkBackup(pNtk);
  iStep = Abc_NtkStep(pNtk);
  if (pNtk_00 != (Abc_Ntk_t *)0x0) {
    pNetBackup = Abc_NtkBackup(pNtk_00);
    iStep_00 = Abc_NtkStep(pNtk_00);
    Abc_NtkSetBackup(pNtk,pNetBackup);
    Abc_NtkSetStep(pNtk,iStep_00);
    Abc_NtkSetBackup(pNtk_00,pNtk);
    Abc_NtkSetStep(pNtk_00,iStep);
    p->pNtkCur = pNtk_00;
  }
  return;
}

Assistant:

void Abc_FrameSwapCurrentAndBackup( Abc_Frame_t * p )
{
    Abc_Ntk_t * pNtkCur, * pNtkBack, * pNtkBack2;
    int iStepCur, iStepBack;

    pNtkCur  = p->pNtkCur;
    pNtkBack = Abc_NtkBackup( pNtkCur );
    iStepCur = Abc_NtkStep  ( pNtkCur );

    // if there is no backup nothing to reset
    if ( pNtkBack == NULL )
        return;

    // remember the backup of the backup
    pNtkBack2 = Abc_NtkBackup( pNtkBack );
    iStepBack = Abc_NtkStep  ( pNtkBack );

    // set pNtkCur to be the next after the backup's backup
    Abc_NtkSetBackup( pNtkCur, pNtkBack2 );
    Abc_NtkSetStep  ( pNtkCur, iStepBack );

    // set pNtkCur to be the next after the backup
    Abc_NtkSetBackup( pNtkBack, pNtkCur );
    Abc_NtkSetStep  ( pNtkBack, iStepCur );

    // set the current network
    p->pNtkCur = pNtkBack;
}